

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

int64_t __thiscall
spvtools::opt::anon_unknown_15::CalculateConstantTerm
          (anon_unknown_15 *this,
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          *recurrences,
          vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
          *constants)

{
  long lVar1;
  pointer ppSVar2;
  long lVar3;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *__range2;
  
  if (this == (anon_unknown_15 *)recurrences) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = (**(code **)(**(long **)(*(long *)this + 0x38) + 0x20))();
      lVar3 = lVar3 + *(long *)(lVar1 + 0x30);
      this = this + 8;
    } while (this != (anon_unknown_15 *)recurrences);
  }
  for (ppSVar2 = (constants->
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppSVar2 !=
      (constants->
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    lVar3 = lVar3 + (*ppSVar2)->literal_value_;
  }
  return lVar3;
}

Assistant:

int64_t CalculateConstantTerm(const std::vector<SERecurrentNode*>& recurrences,
                              const std::vector<SEConstantNode*>& constants) {
  int64_t constant_term = 0;
  for (auto recurrence : recurrences) {
    constant_term +=
        recurrence->GetOffset()->AsSEConstantNode()->FoldToSingleValue();
  }

  for (auto constant : constants) {
    constant_term += constant->FoldToSingleValue();
  }

  return constant_term;
}